

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O3

FT_Error pfr_face_init(FT_Stream stream,FT_Face pfrface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  FT_UInt32 size;
  byte *pbVar4;
  FT_String *pFVar5;
  uint uVar6;
  FT_Stream pFVar7;
  FT_ListNode pFVar8;
  FT_Long FVar9;
  FT_UInt16 FVar10;
  FT_Error FVar11;
  FT_ULong FVar12;
  ushort *puVar13;
  FT_Bitmap_Size *pFVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ushort uVar19;
  ushort *puVar20;
  ulong uVar21;
  uint *puVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  int *piVar26;
  uint uVar27;
  uint uVar28;
  FT_UInt count;
  ushort *puVar29;
  FT_Error error;
  FT_CharMapRec_ local_48;
  FT_Error local_34;
  
  FVar11 = FT_Stream_Seek(stream,0);
  if (FVar11 != 0) {
    return 2;
  }
  FVar11 = FT_Stream_ReadFields(stream,pfr_header_fields,pfrface + 1);
  if (FVar11 != 0) {
    return 2;
  }
  FVar9 = pfrface[1].num_faces;
  piVar26 = (int *)((long)&pfrface[1].num_glyphs + 4);
  *piVar26 = *piVar26 + pfrface[1].num_charmaps * 0x10000;
  if ((int)FVar9 != 0x50465230) {
    return 2;
  }
  if (4 < *(uint *)((long)&pfrface[1].num_faces + 4)) {
    return 2;
  }
  if (*(uint *)((long)&pfrface[1].face_index + 4) < 0x3a) {
    return 2;
  }
  if ((int)pfrface[1].face_index != 0xd0a) {
    return 2;
  }
  uVar18 = (ulong)*(uint *)((long)&pfrface[1].face_flags + 4);
  local_48.face._0_4_ = FT_Stream_Seek(stream,uVar18);
  if ((FT_Error)local_48.face != 0) {
    return (FT_Error)local_48.face;
  }
  FVar10 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_48);
  if ((FT_Error)local_48.face != 0) {
    return (FT_Error)local_48.face;
  }
  if (0x3332 < FVar10) {
    return 8;
  }
  if (stream->size - uVar18 <= (ulong)((uint)FVar10 + (uint)FVar10 * 4 + 2)) {
    return 8;
  }
  uVar15 = (uint)FVar10;
  if (stream->size <= (ulong)((((uint)FVar10 + (uint)FVar10 * 2) * 8 - uVar15) + 0x5f)) {
    return 8;
  }
  local_34 = 0;
  pfrface->num_faces = (ulong)uVar15;
  if (face_index < 0) {
    return 0;
  }
  uVar28 = face_index & 0xffff;
  if (uVar15 <= uVar28) {
    return 6;
  }
  iVar16 = pfrface[1].num_charmaps;
  local_48.face._0_4_ = FT_Stream_Seek(stream,(ulong)*(uint *)((long)&pfrface[1].face_flags + 4));
  if ((FT_Error)local_48.face != 0) {
    return (FT_Error)local_48.face;
  }
  FVar10 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_48);
  if ((FT_Error)local_48.face != 0) {
    return (FT_Error)local_48.face;
  }
  if (FVar10 <= uVar28) {
    return 6;
  }
  local_48.face._0_4_ = FT_Stream_Skip(stream,(ulong)(uVar28 * 5));
  if ((FT_Error)local_48.face != 0) {
    return (FT_Error)local_48.face;
  }
  FVar10 = FT_Stream_ReadUShort(stream,(FT_Error *)&local_48);
  if ((FT_Error)local_48.face != 0) {
    return (FT_Error)local_48.face;
  }
  FVar12 = FT_Stream_ReadUOffset(stream,(FT_Error *)&local_48);
  if ((FT_Error)local_48.face != 0) {
    return (FT_Error)local_48.face;
  }
  uVar15 = (uint)FVar10;
  *(uint *)((long)&pfrface[1].bbox.xMin + 4) = uVar15;
  *(int *)&pfrface[1].bbox.yMin = (int)FVar12;
  local_48.face._0_4_ = FT_Stream_Seek(stream,FVar12 & 0xffffffff);
  if ((FT_Error)local_48.face != 0) {
    return (FT_Error)local_48.face;
  }
  FVar11 = FT_Stream_EnterFrame(stream,(ulong)uVar15);
  if (FVar11 != 0) {
    return FVar11;
  }
  if (FVar10 < 0xd) {
LAB_0022924d:
    local_48.face._0_4_ = 8;
  }
  else {
    pbVar4 = stream->cursor;
    puVar29 = (ushort *)(pbVar4 + uVar15);
    *(int *)((long)&pfrface[1].bbox.yMin + 4) =
         (int)((uint)pbVar4[2] << 8 | (uint)pbVar4[1] << 0x10 | (uint)*pbVar4 << 0x18) >> 8;
    *(int *)&pfrface[1].bbox.xMax =
         (int)((uint)pbVar4[5] << 8 | (uint)pbVar4[4] << 0x10 | (uint)pbVar4[3] << 0x18) >> 8;
    *(int *)((long)&pfrface[1].bbox.xMax + 4) =
         (int)((uint)pbVar4[8] << 8 | (uint)pbVar4[7] << 0x10 | (uint)pbVar4[6] << 0x18) >> 8;
    *(int *)&pfrface[1].bbox.yMax =
         (int)((uint)pbVar4[0xb] << 8 | (uint)pbVar4[10] << 0x10 | (uint)pbVar4[9] << 0x18) >> 8;
    puVar20 = (ushort *)(pbVar4 + 0xd);
    bVar1 = pbVar4[0xc];
    uVar15 = 0;
    if ((bVar1 & 4) != 0) {
      uVar23 = (uint)((bVar1 & 8) == 0);
      uVar15 = uVar23 ^ 5;
      if ((bVar1 & 3) != 0) {
        uVar15 = 2 - uVar23;
      }
    }
    if (puVar29 < (ushort *)
                  ((ulong)((2 - ((bVar1 & 0x20) == 0) & (int)((uint)bVar1 << 0x1b) >> 0x1f) + uVar15
                          ) + (long)puVar20)) goto LAB_0022924d;
    if ((bVar1 & 4) != 0) {
      uVar19 = *puVar20;
      uVar15 = (uint)(ushort)(byte)uVar19;
      if ((bVar1 & 8) == 0) {
        puVar20 = (ushort *)(pbVar4 + 0xe);
      }
      else {
        puVar20 = (ushort *)(pbVar4 + 0xf);
        uVar15 = (int)(short)((ushort)(byte)uVar19 << 8) | (uint)pbVar4[0xe];
      }
      pfrface[1].units_per_EM = (short)uVar15;
      pfrface[1].ascender = (short)(uVar15 >> 0x10);
      if ((bVar1 & 3) == 0) {
        uVar19 = *puVar20;
        pbVar4 = (byte *)((long)puVar20 + 1);
        puVar13 = puVar20 + 1;
        puVar20 = (ushort *)((long)puVar20 + 3);
        iVar25 = (int)((uint)(byte)*puVar13 << 8 |
                      (uint)*pbVar4 << 0x10 | (uint)(byte)uVar19 << 0x18) >> 8;
        pfrface[1].max_advance_width = (short)iVar25;
        pfrface[1].max_advance_height = (short)((uint)iVar25 >> 0x10);
      }
    }
    if ((bVar1 & 0x10) != 0) {
      uVar19 = *puVar20;
      uVar15 = (uint)(ushort)(byte)uVar19;
      if ((bVar1 & 0x20) == 0) {
        puVar20 = (ushort *)((long)puVar20 + 1);
      }
      else {
        pbVar4 = (byte *)((long)puVar20 + 1);
        puVar20 = puVar20 + 1;
        uVar15 = (int)(short)((ushort)(byte)uVar19 << 8) | (uint)*pbVar4;
      }
      pfrface[1].descender = (short)uVar15;
      pfrface[1].height = (short)(uVar15 >> 0x10);
    }
    puVar13 = puVar20;
    if ((bVar1 & 0x40) != 0) {
      puVar13 = (ushort *)((long)puVar20 + 1);
      if (puVar29 < puVar13) goto LAB_0022924d;
      uVar15 = (uint)(byte)*puVar20;
      if ((byte)*puVar20 != 0) {
        do {
          if ((puVar29 < puVar13 + 1) ||
             (puVar13 = (ushort *)((long)(puVar13 + 1) + (ulong)(byte)*puVar13), puVar29 < puVar13))
          goto LAB_0022924d;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
    }
    local_48.face._0_4_ = 0;
    if (puVar29 < (ushort *)((long)puVar13 + 5U)) goto LAB_0022924d;
    uVar19 = *puVar13 << 8 | *puVar13 >> 8;
    pfrface[1].underline_position = (short)(uint)uVar19;
    pfrface[1].underline_thickness = (short)((uint)uVar19 >> 0x10);
    *(uint *)&pfrface[1].glyph =
         (uint)(byte)puVar13[2] |
         (uint)*(byte *)((long)puVar13 + 3) << 8 | (uint)(byte)puVar13[1] << 0x10;
    if (iVar16 != 0) {
      if (puVar29 < puVar13 + 3) goto LAB_0022924d;
      uVar15 = (uint)CONCAT12(*(byte *)((long)puVar13 + 5U),uVar19);
      pfrface[1].underline_position = (short)uVar15;
      pfrface[1].underline_thickness = (short)(uVar15 >> 0x10);
    }
  }
  FT_Stream_ExitFrame(stream);
  if ((FT_Error)local_48.face != 0) {
    return (FT_Error)local_48.face;
  }
  size._0_2_ = pfrface[1].underline_position;
  size._2_2_ = pfrface[1].underline_thickness;
  local_34 = pfr_phy_font_load((PFR_PhyFont)&pfrface[1].size,stream,*(FT_UInt32 *)&pfrface[1].glyph,
                               size);
  if (local_34 != 0) {
    return local_34;
  }
  pfrface->face_index = (ulong)uVar28;
  uVar15 = *(uint *)&pfrface[2].generic.data;
  uVar21 = (ulong)uVar15;
  uVar18 = pfrface->face_flags;
  uVar17 = uVar18 | 1;
  pfrface->num_glyphs = uVar21 + 1;
  pfrface->face_flags = uVar17;
  if (uVar21 == 0) {
    uVar24 = 0;
LAB_002292da:
    if ((uint)uVar24 != uVar15) goto LAB_002292f2;
  }
  else {
    piVar26 = (int *)(pfrface[2].bbox.xMin + 0xc);
    uVar24 = 0;
    do {
      if (*piVar26 != 0) goto LAB_002292da;
      uVar24 = uVar24 + 1;
      piVar26 = piVar26 + 4;
    } while (uVar21 != uVar24);
  }
  if (*(int *)&pfrface[2].style_name == 0) {
    return 3;
  }
  uVar17 = uVar18 & 0xfffffffffffffffe;
LAB_002292f2:
  uVar15 = *(uint *)&pfrface[1].autohint.data;
  uVar28 = *(uint *)&pfrface[2].style_name;
  uVar21 = (ulong)uVar28;
  uVar18 = (ulong)((uVar15 & 1) << 4) + 0x10 | ~uVar15 & 4 | uVar17;
  pfrface->face_flags = uVar18;
  if (uVar21 != 0) {
    uVar18 = uVar18 | 2;
    pfrface->face_flags = uVar18;
  }
  if ((int)pfrface[2].bbox.yMin != 0) {
    pfrface->face_flags = uVar18 | 0x40;
  }
  pFVar5 = (FT_String *)pfrface[2].num_glyphs;
  pfrface->family_name = pFVar5;
  if (pFVar5 == (FT_String *)0x0) {
    pfrface->family_name = (FT_String *)pfrface[2].style_flags;
  }
  uVar23 = *(uint *)&pfrface[1].driver;
  sVar2 = *(short *)&pfrface[1].sizes_list.tail;
  sVar3 = *(short *)&pfrface[1].stream;
  uVar6 = (uVar23 & 0xffff) * 0xc;
  uVar27 = (int)sVar2 - (int)sVar3;
  if ((int)uVar27 <= (int)(short)((ulong)uVar6 * 0x1999999a >> 0x20)) {
    uVar27 = uVar6 / 10;
  }
  pfrface->style_name = pfrface[2].family_name;
  pfrface->num_fixed_sizes = 0;
  pfrface->available_sizes = (FT_Bitmap_Size *)0x0;
  pFVar7 = pfrface[1].stream;
  (pfrface->bbox).xMin = (FT_Pos)pfrface[1].memory;
  (pfrface->bbox).yMin = (FT_Pos)pFVar7;
  pFVar8 = pfrface[1].sizes_list.tail;
  (pfrface->bbox).xMax = (FT_Pos)pfrface[1].sizes_list.head;
  (pfrface->bbox).yMax = (FT_Pos)pFVar8;
  pfrface->units_per_EM = (FT_UShort)uVar23;
  pfrface->ascender = sVar2;
  pfrface->descender = sVar3;
  pfrface->height = (FT_Short)uVar27;
  if (uVar28 != 0) {
    pFVar14 = (FT_Bitmap_Size *)
              ft_mem_qrealloc(pfrface->stream->memory,0x20,0,uVar21,(void *)0x0,&local_34);
    pfrface->available_sizes = pFVar14;
    if (local_34 != 0) {
      return local_34;
    }
    piVar26 = (int *)(*(long *)&pfrface[2].num_fixed_sizes + 4);
    do {
      iVar16 = *piVar26;
      pFVar14->height = (FT_Short)iVar16;
      iVar25 = piVar26[-1];
      pFVar14->width = (FT_Short)iVar25;
      uVar18 = (ulong)(uint)(iVar16 << 6);
      pFVar14->size = uVar18;
      pFVar14->x_ppem = (ulong)(uint)(iVar25 << 6);
      pFVar14->y_ppem = uVar18;
      pFVar14 = pFVar14 + 1;
      piVar26 = piVar26 + 10;
      uVar15 = (int)uVar21 - 1;
      uVar21 = (ulong)uVar15;
    } while (uVar15 != 0);
    pfrface->num_fixed_sizes = uVar28;
    uVar15 = *(uint *)&pfrface[1].autohint.data;
  }
  if ((uVar15 & 4) == 0) {
    uVar15 = (uint)*(ushort *)((long)&pfrface[1].autohint.data + 4);
  }
  else {
    iVar16 = *(int *)&pfrface[2].generic.data;
    uVar15 = 0;
    if (iVar16 != 0) {
      puVar22 = (uint *)(pfrface[2].bbox.xMin + 4);
      do {
        uVar28 = *puVar22;
        if ((int)*puVar22 < (int)uVar15) {
          uVar28 = uVar15;
        }
        uVar15 = uVar28;
        puVar22 = puVar22 + 4;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
  }
  pfrface->max_advance_width = (FT_Short)uVar15;
  pfrface->max_advance_height = pfrface->height;
  pfrface->underline_position = -(pfrface->units_per_EM / 10);
  pfrface->underline_thickness = pfrface->units_per_EM / 0x1e;
  local_48.encoding = FT_ENCODING_UNICODE;
  local_48.platform_id = 3;
  local_48.encoding_id = 1;
  local_48.face = pfrface;
  FVar11 = FT_CMap_New(&pfr_cmap_class_rec,(FT_Pointer)0x0,&local_48,(FT_CMap_conflict *)0x0);
  if ((int)pfrface[2].bbox.yMin != 0) {
    *(byte *)&pfrface->face_flags = (byte)pfrface->face_flags | 0x40;
  }
  return FVar11;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_face_init( FT_Stream      stream,
                 FT_Face        pfrface,
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    PFR_Face  face = (PFR_Face)pfrface;
    FT_Error  error;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "PFR driver\n" ));

    /* load the header and check it */
    error = pfr_header_load( &face->header, stream );
    if ( error )
    {
      FT_TRACE2(( "  not a PFR font\n" ));
      error = FT_THROW( Unknown_File_Format );
      goto Exit;
    }

    if ( !pfr_header_check( &face->header ) )
    {
      FT_TRACE2(( "  not a PFR font\n" ));
      error = FT_THROW( Unknown_File_Format );
      goto Exit;
    }

    /* check face index */
    {
      FT_Long  num_faces;


      error = pfr_log_font_count( stream,
                                  face->header.log_dir_offset,
                                  &num_faces );
      if ( error )
        goto Exit;

      pfrface->num_faces = num_faces;
    }

    if ( face_index < 0 )
      goto Exit;

    if ( ( face_index & 0xFFFF ) >= pfrface->num_faces )
    {
      FT_ERROR(( "pfr_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* load the face */
    error = pfr_log_font_load(
              &face->log_font,
              stream,
              (FT_UInt)( face_index & 0xFFFF ),
              face->header.log_dir_offset,
              FT_BOOL( face->header.phy_font_max_size_high ) );
    if ( error )
      goto Exit;

    /* load the physical font descriptor */
    error = pfr_phy_font_load( &face->phy_font, stream,
                               face->log_font.phys_offset,
                               face->log_font.phys_size );
    if ( error )
      goto Exit;

    /* set up all root face fields */
    {
      PFR_PhyFont  phy_font = &face->phy_font;


      pfrface->face_index = face_index & 0xFFFF;
      pfrface->num_glyphs = (FT_Long)phy_font->num_chars + 1;

      pfrface->face_flags |= FT_FACE_FLAG_SCALABLE;

      /* if gps_offset == 0 for all characters, we  */
      /* assume that the font only contains bitmaps */
      {
        FT_UInt  nn;


        for ( nn = 0; nn < phy_font->num_chars; nn++ )
          if ( phy_font->chars[nn].gps_offset != 0 )
            break;

        if ( nn == phy_font->num_chars )
        {
          if ( phy_font->num_strikes > 0 )
            pfrface->face_flags &= ~FT_FACE_FLAG_SCALABLE;
          else
          {
            FT_ERROR(( "pfr_face_init: font doesn't contain glyphs\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }
        }
      }

      if ( !( phy_font->flags & PFR_PHY_PROPORTIONAL ) )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( phy_font->flags & PFR_PHY_VERTICAL )
        pfrface->face_flags |= FT_FACE_FLAG_VERTICAL;
      else
        pfrface->face_flags |= FT_FACE_FLAG_HORIZONTAL;

      if ( phy_font->num_strikes > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_SIZES;

      if ( phy_font->num_kern_pairs > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;

      /* If no family name was found in the `undocumented' auxiliary
       * data, use the font ID instead.  This sucks but is better than
       * nothing.
       */
      pfrface->family_name = phy_font->family_name;
      if ( !pfrface->family_name )
        pfrface->family_name = phy_font->font_id;

      /* note that the style name can be NULL in certain PFR fonts,
       * probably meaning `Regular'
       */
      pfrface->style_name = phy_font->style_name;

      pfrface->num_fixed_sizes = 0;
      pfrface->available_sizes = NULL;

      pfrface->bbox         = phy_font->bbox;
      pfrface->units_per_EM = (FT_UShort)phy_font->outline_resolution;
      pfrface->ascender     = (FT_Short) phy_font->bbox.yMax;
      pfrface->descender    = (FT_Short) phy_font->bbox.yMin;

      pfrface->height = (FT_Short)( ( pfrface->units_per_EM * 12 ) / 10 );
      if ( pfrface->height < pfrface->ascender - pfrface->descender )
        pfrface->height = (FT_Short)( pfrface->ascender - pfrface->descender );

      if ( phy_font->num_strikes > 0 )
      {
        FT_UInt          n, count = phy_font->num_strikes;
        FT_Bitmap_Size*  size;
        PFR_Strike       strike;
        FT_Memory        memory = pfrface->stream->memory;


        if ( FT_QNEW_ARRAY( pfrface->available_sizes, count ) )
          goto Exit;

        size   = pfrface->available_sizes;
        strike = phy_font->strikes;
        for ( n = 0; n < count; n++, size++, strike++ )
        {
          size->height = (FT_Short)strike->y_ppm;
          size->width  = (FT_Short)strike->x_ppm;
          size->size   = (FT_Pos)( strike->y_ppm << 6 );
          size->x_ppem = (FT_Pos)( strike->x_ppm << 6 );
          size->y_ppem = (FT_Pos)( strike->y_ppm << 6 );
        }
        pfrface->num_fixed_sizes = (FT_Int)count;
      }

      /* now compute maximum advance width */
      if ( ( phy_font->flags & PFR_PHY_PROPORTIONAL ) == 0 )
        pfrface->max_advance_width = (FT_Short)phy_font->standard_advance;
      else
      {
        FT_Int    max = 0;
        FT_UInt   count = phy_font->num_chars;
        PFR_Char  gchar = phy_font->chars;


        for ( ; count > 0; count--, gchar++ )
        {
          if ( max < gchar->advance )
            max = gchar->advance;
        }

        pfrface->max_advance_width = (FT_Short)max;
      }

      pfrface->max_advance_height = pfrface->height;

      pfrface->underline_position  = (FT_Short)( -pfrface->units_per_EM / 10 );
      pfrface->underline_thickness = (FT_Short)(  pfrface->units_per_EM / 30 );

      /* create charmap */
      {
        FT_CharMapRec  charmap;


        charmap.face        = pfrface;
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( &pfr_cmap_class_rec, NULL, &charmap, NULL );
      }

      /* check whether we have loaded any kerning pairs */
      if ( phy_font->num_kern_pairs )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;
    }

  Exit:
    return error;
  }